

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_ptr.h
# Opt level: O3

unique_ptr<solitaire::colliders::TableauPileColliderMock,_std::default_delete<solitaire::colliders::TableauPileColliderMock>_>
 __thiscall
mock_ptr<solitaire::colliders::TableauPileColliderMock>::make_unique
          (mock_ptr<solitaire::colliders::TableauPileColliderMock> *this)

{
  runtime_error *this_00;
  undefined8 *in_RSI;
  
  if (*(char *)(in_RSI + 1) != '\x01') {
    *(undefined1 *)(in_RSI + 1) = 1;
    this->rawPointer = (TableauPileColliderMock *)*in_RSI;
    return (__uniq_ptr_data<solitaire::colliders::TableauPileColliderMock,_std::default_delete<solitaire::colliders::TableauPileColliderMock>,_true,_true>
            )(__uniq_ptr_data<solitaire::colliders::TableauPileColliderMock,_std::default_delete<solitaire::colliders::TableauPileColliderMock>,_true,_true>
              )this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"unique_ptr has already been created");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<T> make_unique() {
        if (isUniquePointerCreated)
            throw std::runtime_error {"unique_ptr has already been created"};

        isUniquePointerCreated = true;
        return std::unique_ptr<T>(rawPointer);
    }